

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O2

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::GenMatcher::Substitution::
~Substitution(Substitution *this)

{
  ~Substitution(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

~Substitution()
  {
    if(_applicator) {
      delete _applicator;
    }
  }